

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall
tonk::Connection::queueAddressAndIdChangeMessage(Connection *this,UDPAddress *peerUDPAddress)

{
  int iVar1;
  size_t i;
  long lVar2;
  size_t sStack_200;
  uint8_t data [22];
  bytes_type addrData;
  undefined4 uStack_1d4;
  undefined1 local_1c0 [8];
  address_v4 v4addr;
  undefined4 uStack_1b4;
  address ipaddr;
  
  data[0] = 0x80;
  data[3] = (uint8_t)(this->LocallyAssignedIdForRemoteHost >> 0x10);
  data._1_2_ = (undefined2)this->LocallyAssignedIdForRemoteHost;
  data._4_2_ = swap_bytes((peerUDPAddress->impl_).data_.v4.sin_port);
  if ((peerUDPAddress->impl_).data_.base.sa_family == 2) {
    ipaddr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    ipaddr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    ipaddr.ipv6_address_.scope_id_ = 0;
    ipaddr._0_8_ = (ulong)(peerUDPAddress->impl_).data_.v6.sin6_flowinfo << 0x20;
    asio::ip::address::to_v4((address *)&v4addr);
    _addrData = CONCAT44(uStack_1d4,v4addr.addr_.s_addr);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      data[lVar2 + 6] = addrData._M_elems[lVar2];
    }
    sStack_200 = 10;
  }
  else {
    ipaddr.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 8);
    ipaddr.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 0x10);
    ipaddr.ipv6_address_.scope_id_ = (unsigned_long)(peerUDPAddress->impl_).data_.v6.sin6_scope_id;
    ipaddr.type_ = ipv6;
    ipaddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    asio::ip::address::to_v6((address_v6 *)&v4addr,&ipaddr);
    _addrData = CONCAT44(uStack_1b4,v4addr.addr_.s_addr);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      data[lVar2 + 6] = addrData._M_elems[lVar2];
    }
    sStack_200 = 0x16;
  }
  iVar1 = bcmp(this->LastIdAndAddressSent,data,sStack_200);
  if (iVar1 != 0) {
    SessionOutgoing::QueueControl
              ((SessionOutgoing *)local_1c0,(uint8_t *)&this->Outgoing,(size_t)data);
    Result::~Result((Result *)local_1c0);
    memcpy(this->LastIdAndAddressSent,data,sStack_200);
  }
  return;
}

Assistant:

void Connection::queueAddressAndIdChangeMessage(const UDPAddress& peerUDPAddress)
{
    try
    {
        uint8_t data[protocol::kMaxClientIdAndAddressBytes];

        data[0] = protocol::ControlChannel_S2C_ClientIdAndAddress;
        siamese::WriteU24_LE(data + 1, LocallyAssignedIdForRemoteHost);
        siamese::WriteU16_LE(data + 1 + 3, peerUDPAddress.port());
        size_t written = 1 + 3 + 2;

        const asio::ip::address ipaddr = peerUDPAddress.address();
        if (ipaddr.is_v4())
        {
            const asio::ip::address_v4 v4addr = ipaddr.to_v4();
            const auto addrData = v4addr.to_bytes();
            for (size_t i = 0; i < addrData.size(); ++i) {
                data[written + i] = addrData[i];
            }
            written += addrData.size(); // Length implies IPv4
        }
        else if (ipaddr.is_v6())
        {
            const asio::ip::address_v6 v6addr = ipaddr.to_v6();
            const auto addrData = v6addr.to_bytes();
            for (size_t i = 0; i < addrData.size(); ++i) {
                data[written + i] = addrData[i];
            }
            written += addrData.size(); // Length implies IPv6
        }
        else
        {
            TONK_DEBUG_BREAK();
            return;
        }

        TONK_DEBUG_ASSERT(written <= protocol::kMaxClientIdAndAddressBytes);

        // Note: Sometimes the same IP:port can be contacted twice in a row
        // from e.g. hostname resolution.  Avoid queuing the same data twice.
        if (0 != memcmp(LastIdAndAddressSent, data, written))
        {
            Outgoing.QueueControl(data, written);
            memcpy(LastIdAndAddressSent, data, written);
        }
    }
    catch (...)
    {
        Logger.Error("queueAddressAndIdChangeMessage: Exception while converting IP address");
    }
}